

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::DestroyTree<1ul>(CordRepBtree *tree)

{
  CordRep *rep;
  bool bVar1;
  CordRepBtree *pCVar2;
  iterator ppCVar3;
  CordRep *edge;
  iterator __end4;
  iterator __begin4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_48;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  CordRep *node;
  iterator __end3;
  iterator __begin3;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_18;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range3;
  CordRepBtree *tree_local;
  
  __range3 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)tree;
  ___begin3 = CordRepBtree::Edges(tree);
  local_18 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin3;
  __end3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_18);
  node = (CordRep *)Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_18);
  for (; (CordRep *)__end3 != node; __end3 = __end3 + 1) {
    __range4 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)*__end3;
    bVar1 = RefcountAndFlags::Decrement(&((CordRep *)__range4)->refcount);
    if (!bVar1) {
      pCVar2 = CordRep::btree((CordRep *)__range4);
      ___begin4 = CordRepBtree::Edges(pCVar2);
      local_48 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
      __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_48);
      ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_48);
      for (; __end4 != ppCVar3; __end4 = __end4 + 1) {
        rep = *__end4;
        bVar1 = RefcountAndFlags::Decrement(&rep->refcount);
        if (!bVar1) {
          anon_unknown_0::DeleteLeafEdge(rep);
        }
      }
      pCVar2 = CordRep::btree((CordRep *)__range4);
      CordRepBtree::Delete(pCVar2);
    }
  }
  CordRepBtree::Delete((CordRepBtree *)__range3);
  return;
}

Assistant:

static void DestroyTree(CordRepBtree* tree) {
  for (CordRep* node : tree->Edges()) {
    if (node->refcount.Decrement()) continue;
    for (CordRep* edge : node->btree()->Edges()) {
      if (edge->refcount.Decrement()) continue;
      if (size == 1) {
        DeleteLeafEdge(edge);
      } else {
        CordRepBtree::Destroy(edge->btree());
      }
    }
    CordRepBtree::Delete(node->btree());
  }
  CordRepBtree::Delete(tree);
}